

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

OBJ_DATA * new_obj(void)

{
  OBJ_DATA *obj;
  OBJ_DATA *local_8;
  
  if (obj_free == (OBJ_DATA *)0x0) {
    local_8 = (OBJ_DATA *)operator_new(0x158);
  }
  else {
    local_8 = obj_free;
    obj_free = obj_free->next;
  }
  memcpy(local_8,&new_obj::obj_zero,0x158);
  local_8->valid = true;
  return local_8;
}

Assistant:

OBJ_DATA *new_obj(void)
{
	static OBJ_DATA obj_zero;
	OBJ_DATA *obj;

	if (obj_free == nullptr)
	{
		obj = new OBJ_DATA;
	}
	else
	{
		obj = obj_free;
		obj_free = obj_free->next;
	}

	*obj = obj_zero;

	obj->valid = true;
	return obj;
}